

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O2

int __thiscall pg::DTLSolver::best_vertices(DTLSolver *this,bitset *V,bitset *R,int player)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Game *pGVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  byte bVar7;
  size_t sVar8;
  size_t sVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  ostream *poVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  int t;
  int iVar21;
  long local_e8;
  _label_vertex local_c8;
  bitset Z;
  bitset local_98;
  bitset *local_78;
  bitset CurZ;
  bitset CurR;
  
  bVar10 = bitset::none(V);
  if (!bVar10) {
    __assert_fail("V.none()",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                  ,0x288,"int pg::DTLSolver::best_vertices(bitset &, bitset &, const int)");
  }
  bitset::bitset(&local_98,((this->super_Solver).game)->n_vertices);
  bitset::bitset(&Z,((this->super_Solver).game)->n_vertices);
  bitset::bitset(&CurR,((this->super_Solver).game)->n_vertices);
  bitset::bitset(&CurZ,((this->super_Solver).game)->n_vertices);
  pGVar4 = (this->super_Solver).game;
  puVar5 = R->_bits;
  puVar6 = V->_bits;
  bVar10 = false;
  for (uVar20 = 0; (long)uVar20 < pGVar4->n_vertices; uVar20 = uVar20 + 1) {
    if (((puVar5[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0) &&
       ((pGVar4->_priority[uVar20] & 1U) == player)) {
      puVar6[uVar20 >> 6] = puVar6[uVar20 >> 6] | 1L << (uVar20 & 0x3f);
      bVar10 = true;
    }
  }
  iVar11 = 0;
  if (bVar10) {
    iVar11 = 0;
    local_78 = R;
    do {
      bitset::operator=(&local_98,V);
      if (2 < (this->super_Solver).trace) {
        std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;202mcurrent best vertices:\x1b[m");
        for (sVar13 = bitset::find_first(V); poVar14 = (this->super_Solver).logger,
            sVar13 != 0xffffffffffffffff; sVar13 = bitset::find_next(V,sVar13)) {
          poVar14 = std::operator<<(poVar14," \x1b[1;38;5;15m");
          local_c8.g = (this->super_Solver).game;
          local_c8.v = (int)sVar13;
          poVar14 = operator<<(poVar14,&local_c8);
          std::operator<<(poVar14,"\x1b[m");
        }
        std::endl<char,std::char_traits<char>>(poVar14);
      }
      bitset::operator=(&CurR,R);
      uVar20 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
      iVar11 = iVar11 + 1;
      while( true ) {
        uVar20 = uVar20 - 1;
        uVar18 = (uint)uVar20;
        if ((int)uVar18 < 0) break;
        uVar12 = uVar18 & 0x7fffffff;
        uVar15 = uVar12 >> 6;
        if (((V->_bits[uVar15] >> (uVar20 & 0x3f) & 1) != 0) &&
           (uVar16 = 1L << (uVar20 & 0x3f), (Z._bits[uVar15] & uVar16) == 0)) {
          CurZ._bits[uVar15] = CurZ._bits[uVar15] | uVar16;
          this->str[uVar12] = -1;
          iVar1 = (this->Q).pointer;
          (this->Q).pointer = iVar1 + 1;
          (this->Q).queue[iVar1] = uVar18;
          iVar1 = ((this->super_Solver).game)->_priority[uVar12];
          while( true ) {
            iVar21 = (this->Q).pointer;
            if ((long)iVar21 == 0) break;
            (this->Q).pointer = iVar21 + -1;
            uVar2 = (this->Q).queue[(long)iVar21 + -1];
            bVar7 = (byte)uVar2 & 0x3f;
            CurR._bits[(ulong)(long)(int)uVar2 >> 6] =
                 CurR._bits[(ulong)(long)(int)uVar2 >> 6] &
                 (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
            attractVertices(this,player,uVar2,&CurR,&CurZ,&CurR,iVar1);
            attractTangles(this,player,uVar2,&CurR,&CurZ,&CurR,iVar1);
          }
          bitset::operator|=(&Z,&CurZ);
          for (lVar17 = 0; R = local_78, CurZ._bitssize << 3 != lVar17; lVar17 = lVar17 + 8) {
            *(undefined8 *)((long)CurZ._bits + lVar17) = 0;
          }
        }
      }
      local_e8 = 0;
      uVar16 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
      uVar20 = 0;
      while( true ) {
        uVar16 = uVar16 - 1;
        uVar18 = (uint)uVar16;
        if ((int)uVar18 < 0) break;
        if (((V->_bits[uVar18 >> 6 & 0x1ffffff] >> (uVar16 & 0x3f) & 1) != 0) &&
           (bVar10 = attracts(this,player,uVar18,&Z,R), !bVar10)) {
          local_e8 = local_e8 + 1;
          this->Candidates[uVar20] = uVar18;
          uVar20 = (ulong)((int)uVar20 + 1);
        }
      }
      if ((int)uVar20 == 0) {
LAB_001649d7:
        iVar11 = 1;
        goto LAB_001649da;
      }
      pGVar4 = (this->super_Solver).game;
      iVar1 = *(int *)((long)pGVar4->_priority +
                      ((pGVar4->n_vertices << 0x20) + -0x100000000 >> 0x1e));
      for (iVar21 = 0; iVar21 <= iVar1; iVar21 = iVar21 + 1) {
        for (sVar13 = bitset::find_first(&Z); sVar13 != 0xffffffffffffffff;
            sVar13 = bitset::find_next(&Z,sVar13)) {
          iVar3 = (this->Q).pointer;
          (this->Q).pointer = iVar3 + 1;
          (this->Q).queue[iVar3] = (uint)sVar13;
        }
        while( true ) {
          iVar3 = (this->Q).pointer;
          if ((long)iVar3 == 0) break;
          (this->Q).pointer = iVar3 + -1;
          uVar2 = (this->Q).queue[(long)iVar3 + -1];
          attractVertices(this,player,uVar2,R,&Z,R,iVar21);
          attractTangles(this,player,uVar2,R,&Z,R,iVar21);
        }
        lVar19 = 0;
        lVar17 = local_e8;
        while (bVar10 = lVar17 != 0, lVar17 = lVar17 + -1, bVar10) {
          iVar3 = *(int *)((long)this->Candidates + lVar19);
          if ((long)iVar3 != -1) {
            if (((this->super_Solver).game)->_priority[iVar3] <= iVar21) break;
            bVar10 = attracts(this,player,iVar3,&Z,R);
            if (bVar10) {
              *(undefined4 *)((long)this->Candidates + lVar19) = 0xffffffff;
            }
          }
          lVar19 = lVar19 + 4;
        }
      }
      bVar10 = false;
      for (lVar17 = 0; local_e8 != lVar17; lVar17 = lVar17 + 1) {
        iVar1 = this->Candidates[lVar17];
        if ((long)iVar1 != 0xffffffffffffffff) {
          bVar7 = (byte)iVar1 & 0x3f;
          V->_bits[(ulong)(long)iVar1 >> 6] =
               V->_bits[(ulong)(long)iVar1 >> 6] &
               (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
          if (1 < (this->super_Solver).trace) {
            if (!bVar10) {
              poVar14 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;202mdistance ");
              poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar11);
              std::operator<<(poVar14,"\x1b[m:");
            }
            poVar14 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
            local_c8.g = (this->super_Solver).game;
            local_c8.v = iVar1;
            poVar14 = operator<<(poVar14,&local_c8);
            std::operator<<(poVar14,"\x1b[m");
          }
          bVar10 = true;
        }
      }
      if ((bVar10) && (0 < (this->super_Solver).trace)) {
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
      }
      for (lVar17 = 0; Z._bitssize << 3 != lVar17; lVar17 = lVar17 + 8) {
        *(undefined8 *)((long)Z._bits + lVar17) = 0;
      }
      if (!bVar10) goto LAB_001649d7;
      bVar10 = bitset::any(V);
    } while (bVar10);
    sVar8 = V->_size;
    sVar9 = V->_bitssize;
    V->_size = local_98._size;
    V->_bitssize = local_98._bitssize;
    sVar13 = V->_allocsize;
    V->_allocsize = local_98._allocsize;
    puVar5 = V->_bits;
    V->_bits = local_98._bits;
    iVar11 = -1;
    local_98._bits = puVar5;
    local_98._size = sVar8;
    local_98._bitssize = sVar9;
    local_98._allocsize = sVar13;
  }
LAB_001649da:
  bitset::~bitset(&CurZ);
  bitset::~bitset(&CurR);
  bitset::~bitset(&Z);
  bitset::~bitset(&local_98);
  return iVar11;
}

Assistant:

int
DTLSolver::best_vertices(bitset &V, bitset &R, const int player)
{
#ifndef NDEBUG
    // Assume: V is empty
    assert(V.none());
#endif

    bitset prevV(nodecount()); // the previous V
    bitset Z(nodecount()); // the current Z
    bitset CurR(nodecount());
    bitset CurZ(nodecount());
    int curdist = 0;

    /**
     * Initialize V := vertices in <R> with priority of <player>
     */

    bool hasV = false;
    for (int v=0; v<nodecount(); v++) {
        if (R[v] and (priority(v)&1) == player) {
            hasV = true;
            V[v] = true;
        }
    }
    if (!hasV) return 0;

    /**
     * Now we prune until no more vertices are removed from V, or V is empty.
     */

    while (true) {
        curdist++;
        prevV = V;

#ifndef NDEBUG
        if (trace >= 3) {
            logger << "\033[1;38;5;202mcurrent best vertices:\033[m";
            for (auto v = V.find_first(); v != bitset::npos; v = V.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        // First compute the current <player> region Z

        CurR = R;
        for (int top=nodecount()-1; top>=0; top--) {
            if (V[top] and !Z[top]) {
                CurZ[top] = true; // add to <Z>
                str[top] = -1; // don't care, but needed for correct trace reporting
                Q.push(top);
                const int pr = priority(top);
                while (Q.nonempty()) {
                    const int v = Q.pop();
                    CurR[v] = false;
                    attractVertices(player, v, CurR, CurZ, CurR, pr);
                    attractTangles(player, v, CurR, CurZ, CurR, pr);
                }
                Z |= CurZ;
                CurZ.reset();
            }
        }

        /**
         * Now find all Candidates: v \in V that do not yet have a good path to Z
         */

        int n_candidates = 0;
        for (int v=nodecount()-1; v>=0; v--) {
            if (V[v] and !attracts(player, v, Z, R)) Candidates[n_candidates++] = v;
        }
        if (n_candidates == 0) return 1; // no more vertices are removed

        // Now attract from R to Z, "slowly"
        // Note: we have to be carefully increasing t. Why?
        // because we might attract tangles OR vertices at some threshold...
        const int max_prio = priority(nodecount()-1);
        for (int t=0; t<=max_prio; t++) {
            // add vertices in Z to Q
            for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) Q.push(v);

            // run tangle attractor to Z with the given threshold
            while (Q.nonempty()) {
                const int u = Q.pop();
                attractVertices(player, u, R, Z, R, t);
                attractTangles(player, u, R, Z, R, t);
            }

            // Now check if any candidate is now attracted (via the good path)
            for (int x=0; x<n_candidates; x++) {
                const int u = Candidates[x];
                if (u != -1) {
                    if (priority(u) <= t) break; // stop checking once we are below the threshold
                    if (attracts(player, u, Z, R)) Candidates[x] = -1;
                }
            }
        }

        /**
         * We have now attracted all possible vertices to <Z>.
         * Any remaining vertices in Candidates are now distractions...
         */

        bool changed_V = false;
        for (int x=0; x<n_candidates; x++) {
            const int u = Candidates[x];
            if (u == -1) continue;
            V[u] = false;
            if (trace >= 2) {
                if (!changed_V) {
                    logger << "\033[1;38;5;202mdistance " << curdist << "\033[m:";
                }
                logger << " \033[1;36m" << label_vertex(u) << "\033[m";
            }
            changed_V = true;
        }
        if (changed_V and trace >= 1) logger << std::endl;

        Z.reset();

        if (!changed_V) {
            // No vertices were removed from V
            return 1;
        } else if (!V.any()) {
            // All vertices were removed from V
            V.swap(prevV);
            return -1;
        }
    }

    return true;
}